

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void invertBuffer(TidyBuffer *src,TidyBuffer *dst)

{
  byte *__s;
  uint uVar1;
  size_t sVar2;
  uchar uc;
  char *cp;
  char *in;
  uint len;
  TidyBuffer *dst_local;
  TidyBuffer *src_local;
  
  __s = src->bp;
  uVar1 = src->size;
  if (__s != (byte *)0x0) {
    while (in._4_4_ = uVar1, in._4_4_ != 0) {
      uVar1 = in._4_4_ - 1;
      if (__s[uVar1] == ' ') {
        __s[uVar1] = '\0';
        if (dst->size != 0) {
          tidyBufAppend(dst," ",1);
        }
        sVar2 = strlen((char *)(__s + in._4_4_));
        tidyBufAppend(dst,__s + in._4_4_,(uint)sVar2);
      }
    }
    if (dst->size != 0) {
      tidyBufAppend(dst," ",1);
    }
    sVar2 = strlen((char *)__s);
    tidyBufAppend(dst,__s,(uint)sVar2);
  }
  return;
}

Assistant:

static void invertBuffer(TidyBuffer *src, TidyBuffer *dst)
{
    uint len = src->size;
    char *in = (char *)src->bp;
    char *cp;
    if (!in)
        return;
    while (len)
    {
        unsigned char uc;
        len--;
        uc = in[len];
        if (uc == ' ')
        {
            in[len] = 0;
            cp = &in[len + 1];
            if (dst->size)
                tidyBufAppend(dst, " ", 1);
            tidyBufAppend(dst, cp, strlen(cp));
        }
    }
    if (dst->size)
        tidyBufAppend(dst, " ", 1);
    tidyBufAppend(dst, in, strlen(in));
}